

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O0

LY_ERR lysp_stmt_type(lysp_ctx *ctx,lysp_stmt *stmt,lysp_type *type)

{
  ly_stmt lVar1;
  LY_ERR LVar2;
  lysp_restr *plVar3;
  char *pcVar4;
  ly_ctx *local_f8;
  ly_ctx *local_f0;
  ly_ctx *local_e8;
  ly_ctx *local_e0;
  ly_ctx *local_d0;
  ly_ctx *local_c8;
  ly_ctx *local_c0;
  ly_ctx *local_b8;
  ly_ctx *local_a8;
  ly_ctx *local_98;
  ly_ctx *local_90;
  LY_ERR ret___13;
  LY_ERR ret___12;
  char *p__;
  LY_ERR ret___11;
  LY_ERR ret___10;
  LY_ERR ret___9;
  LY_ERR ret___8;
  LY_ERR ret___7;
  LY_ERR ret___6;
  LY_ERR ret___5;
  LY_ERR ret___4;
  LY_ERR ret___3;
  LY_ERR ret___2;
  lysp_stmt *child;
  LY_ERR ret___1;
  LY_ERR ret__;
  LY_ERR ret;
  char *str_path;
  lysp_type *nest_type;
  lysp_type *type_local;
  lysp_stmt *stmt_local;
  lysp_ctx *ctx_local;
  
  _ret__ = (char *)0x0;
  nest_type = type;
  type_local = (lysp_type *)stmt;
  stmt_local = (lysp_stmt *)ctx;
  if (type->name == (char *)0x0) {
    ctx_local._4_4_ = lysp_stmt_validate_value(ctx,Y_PREF_IDENTIF_ARG,stmt->arg);
    if (ctx_local._4_4_ == LY_SUCCESS) {
      if (stmt_local == (lysp_stmt *)0x0) {
        local_98 = (ly_ctx *)0x0;
      }
      else {
        local_98 = *(ly_ctx **)
                    **(undefined8 **)
                      (*(long *)(stmt_local[1].stmt + 8) +
                      (ulong)(*(int *)(stmt_local[1].stmt + 4) - 1) * 8);
      }
      ctx_local._4_4_ = lydict_insert(local_98,(char *)type_local->range,0,&nest_type->name);
      if (ctx_local._4_4_ == LY_SUCCESS) {
        nest_type->pmod =
             *(lysp_module **)
              (*(long *)(stmt_local[1].stmt + 8) + (ulong)(*(int *)(stmt_local[1].stmt + 4) - 1) * 8
              );
        for (_ret___3 = (lysp_stmt *)type_local->bits; _ret___3 != (lysp_stmt *)0x0;
            _ret___3 = _ret___3->next) {
          lVar1 = _ret___3->kw;
          if (lVar1 == LY_STMT_BASE) {
            LVar2 = lysp_stmt_text_fields
                              ((lysp_ctx *)stmt_local,_ret___3,&nest_type->bases,Y_PREF_IDENTIF_ARG,
                               &nest_type->exts);
            if (LVar2 != LY_SUCCESS) {
              return LVar2;
            }
            nest_type->flags = nest_type->flags | 1;
          }
          else if (lVar1 == LY_STMT_BIT) {
            LVar2 = lysp_stmt_type_enum((lysp_ctx *)stmt_local,_ret___3,&nest_type->bits);
            if (LVar2 != LY_SUCCESS) {
              return LVar2;
            }
            nest_type->flags = nest_type->flags | 2;
          }
          else if (lVar1 == LY_STMT_ENUM) {
            LVar2 = lysp_stmt_type_enum((lysp_ctx *)stmt_local,_ret___3,&nest_type->enums);
            if (LVar2 != LY_SUCCESS) {
              return LVar2;
            }
            nest_type->flags = nest_type->flags | 4;
          }
          else if (lVar1 == LY_STMT_EXTENSION_INSTANCE) {
            LVar2 = lysp_stmt_ext((lysp_ctx *)stmt_local,_ret___3,LY_STMT_TYPE,0,&nest_type->exts);
joined_r0x001b81e4:
            if (LVar2 != LY_SUCCESS) {
              return LVar2;
            }
          }
          else if (lVar1 == LY_STMT_FRACTION_DIGITS) {
            LVar2 = lysp_stmt_type_fracdigits
                              ((lysp_ctx *)stmt_local,_ret___3,&nest_type->fraction_digits,
                               &nest_type->exts);
            if (LVar2 != LY_SUCCESS) {
              return LVar2;
            }
            nest_type->flags = nest_type->flags | 8;
          }
          else if (lVar1 == LY_STMT_LENGTH) {
            if (nest_type->length != (lysp_restr *)0x0) {
              if (stmt_local == (lysp_stmt *)0x0) {
                local_a8 = (ly_ctx *)0x0;
              }
              else {
                local_a8 = *(ly_ctx **)
                            **(undefined8 **)
                              (*(long *)(stmt_local[1].stmt + 8) +
                              (ulong)(*(int *)(stmt_local[1].stmt + 4) - 1) * 8);
              }
              pcVar4 = lyplg_ext_stmt2str(_ret___3->kw);
              ly_vlog(local_a8,(char *)0x0,LYVE_SYNTAX_YANG,"Duplicate keyword \"%s\".",pcVar4);
              return LY_EVALID;
            }
            plVar3 = (lysp_restr *)calloc(1,0x40);
            nest_type->length = plVar3;
            if (nest_type->length == (lysp_restr *)0x0) {
              if (stmt_local == (lysp_stmt *)0x0) {
                local_b8 = (ly_ctx *)0x0;
              }
              else {
                local_b8 = *(ly_ctx **)
                            **(undefined8 **)
                              (*(long *)(stmt_local[1].stmt + 8) +
                              (ulong)(*(int *)(stmt_local[1].stmt + 4) - 1) * 8);
              }
              ly_log(local_b8,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_stmt_type");
              return LY_EMEM;
            }
            LVar2 = lysp_stmt_restr((lysp_ctx *)stmt_local,_ret___3,nest_type->length);
            if (LVar2 != LY_SUCCESS) {
              return LVar2;
            }
            nest_type->flags = nest_type->flags | 0x10;
          }
          else if (lVar1 == LY_STMT_PATH) {
            LVar2 = lysp_stmt_text_field
                              ((lysp_ctx *)stmt_local,_ret___3,0,(char **)&ret__,Y_STR_ARG,
                               &nest_type->exts);
            if (LVar2 != LY_SUCCESS) {
              return LVar2;
            }
            if (stmt_local == (lysp_stmt *)0x0) {
              local_c0 = (ly_ctx *)0x0;
            }
            else {
              local_c0 = *(ly_ctx **)
                          **(undefined8 **)
                            (*(long *)(stmt_local[1].stmt + 8) +
                            (ulong)(*(int *)(stmt_local[1].stmt + 4) - 1) * 8);
            }
            LVar2 = ly_path_parse(local_c0,(lysc_node *)0x0,_ret__,0,'\x01',2,0x10,0x400,
                                  &nest_type->path);
            if (stmt_local == (lysp_stmt *)0x0) {
              local_c8 = (ly_ctx *)0x0;
            }
            else {
              local_c8 = *(ly_ctx **)
                          **(undefined8 **)
                            (*(long *)(stmt_local[1].stmt + 8) +
                            (ulong)(*(int *)(stmt_local[1].stmt + 4) - 1) * 8);
            }
            lydict_remove(local_c8,_ret__);
            if (LVar2 != LY_SUCCESS) {
              return LVar2;
            }
            nest_type->flags = nest_type->flags | 0x20;
          }
          else if (lVar1 == LY_STMT_PATTERN) {
            LVar2 = lysp_stmt_type_pattern((lysp_ctx *)stmt_local,_ret___3,&nest_type->patterns);
            if (LVar2 != LY_SUCCESS) {
              return LVar2;
            }
            nest_type->flags = nest_type->flags | 0x40;
          }
          else if (lVar1 == LY_STMT_RANGE) {
            if (nest_type->range != (lysp_restr *)0x0) {
              if (stmt_local == (lysp_stmt *)0x0) {
                local_d0 = (ly_ctx *)0x0;
              }
              else {
                local_d0 = *(ly_ctx **)
                            **(undefined8 **)
                              (*(long *)(stmt_local[1].stmt + 8) +
                              (ulong)(*(int *)(stmt_local[1].stmt + 4) - 1) * 8);
              }
              pcVar4 = lyplg_ext_stmt2str(_ret___3->kw);
              ly_vlog(local_d0,(char *)0x0,LYVE_SYNTAX_YANG,"Duplicate keyword \"%s\".",pcVar4);
              return LY_EVALID;
            }
            plVar3 = (lysp_restr *)calloc(1,0x40);
            nest_type->range = plVar3;
            if (nest_type->range == (lysp_restr *)0x0) {
              if (stmt_local == (lysp_stmt *)0x0) {
                local_e0 = (ly_ctx *)0x0;
              }
              else {
                local_e0 = *(ly_ctx **)
                            **(undefined8 **)
                              (*(long *)(stmt_local[1].stmt + 8) +
                              (ulong)(*(int *)(stmt_local[1].stmt + 4) - 1) * 8);
              }
              ly_log(local_e0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_stmt_type");
              return LY_EMEM;
            }
            LVar2 = lysp_stmt_restr((lysp_ctx *)stmt_local,_ret___3,nest_type->range);
            if (LVar2 != LY_SUCCESS) {
              return LVar2;
            }
            nest_type->flags = nest_type->flags | 0x80;
          }
          else {
            if (lVar1 == LY_STMT_REQUIRE_INSTANCE) {
              LVar2 = lysp_stmt_type_reqinstance
                                ((lysp_ctx *)stmt_local,_ret___3,&nest_type->require_instance,
                                 &nest_type->flags,&nest_type->exts);
              goto joined_r0x001b81e4;
            }
            if (lVar1 != LY_STMT_TYPE) {
              if (stmt_local == (lysp_stmt *)0x0) {
                local_f8 = (ly_ctx *)0x0;
              }
              else {
                local_f8 = *(ly_ctx **)
                            **(undefined8 **)
                              (*(long *)(stmt_local[1].stmt + 8) +
                              (ulong)(*(int *)(stmt_local[1].stmt + 4) - 1) * 8);
              }
              pcVar4 = lyplg_ext_stmt2str(_ret___3->kw);
              ly_vlog(local_f8,(char *)0x0,LYVE_SYNTAX_YANG,
                      "Invalid keyword \"%s\" as a child of \"%s\".",pcVar4,"type");
              return LY_EVALID;
            }
            if (nest_type->types == (lysp_type *)0x0) {
              _ret___13 = (undefined8 *)malloc(0x70);
              if (_ret___13 == (undefined8 *)0x0) {
                if (stmt_local == (lysp_stmt *)0x0) {
                  local_f0 = (ly_ctx *)0x0;
                }
                else {
                  local_f0 = *(ly_ctx **)
                              **(undefined8 **)
                                (*(long *)(stmt_local[1].stmt + 8) +
                                (ulong)(*(int *)(stmt_local[1].stmt + 4) - 1) * 8);
                }
                ly_log(local_f0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_stmt_type"
                      );
                return LY_EMEM;
              }
              *_ret___13 = 1;
            }
            else {
              *(long *)&nest_type->types[-1].fraction_digits =
                   *(long *)&nest_type->types[-1].fraction_digits + 1;
              _ret___13 = (undefined8 *)
                          realloc(&nest_type->types[-1].fraction_digits,
                                  *(long *)&nest_type->types[-1].fraction_digits * 0x68 + 8);
              if (_ret___13 == (undefined8 *)0x0) {
                *(long *)&nest_type->types[-1].fraction_digits =
                     *(long *)&nest_type->types[-1].fraction_digits + -1;
                if (stmt_local == (lysp_stmt *)0x0) {
                  local_e8 = (ly_ctx *)0x0;
                }
                else {
                  local_e8 = *(ly_ctx **)
                              **(undefined8 **)
                                (*(long *)(stmt_local[1].stmt + 8) +
                                (ulong)(*(int *)(stmt_local[1].stmt + 4) - 1) * 8);
                }
                ly_log(local_e8,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_stmt_type"
                      );
                return LY_EMEM;
              }
            }
            nest_type->types = (lysp_type *)(_ret___13 + 1);
            str_path = (char *)(nest_type->types +
                               *(long *)&nest_type->types[-1].fraction_digits + -1);
            memset(str_path,0,0x68);
            LVar2 = lysp_stmt_type((lysp_ctx *)stmt_local,_ret___3,(lysp_type *)str_path);
            if (LVar2 != LY_SUCCESS) {
              return LVar2;
            }
            nest_type->flags = nest_type->flags | 0x100;
          }
        }
        ctx_local._4_4_ = LY_SUCCESS;
      }
    }
  }
  else {
    if (ctx == (lysp_ctx *)0x0) {
      local_90 = (ly_ctx *)0x0;
    }
    else {
      local_90 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    ly_vlog(local_90,(char *)0x0,LYVE_SYNTAX_YANG,"Duplicate keyword \"%s\".","type");
    ctx_local._4_4_ = LY_EVALID;
  }
  return ctx_local._4_4_;
}

Assistant:

static LY_ERR
lysp_stmt_type(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, struct lysp_type *type)
{
    struct lysp_type *nest_type;
    const char *str_path = NULL;
    LY_ERR ret;

    if (type->name) {
        LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, "type");
        return LY_EVALID;
    }

    LY_CHECK_RET(lysp_stmt_validate_value(ctx, Y_PREF_IDENTIF_ARG, stmt->arg));
    LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), stmt->arg, 0, &type->name));
    type->pmod = PARSER_CUR_PMOD(ctx);

    for (const struct lysp_stmt *child = stmt->child; child; child = child->next) {
        switch (child->kw) {
        case LY_STMT_BASE:
            LY_CHECK_RET(lysp_stmt_text_fields(ctx, child, &type->bases, Y_PREF_IDENTIF_ARG, &type->exts));
            type->flags |= LYS_SET_BASE;
            break;
        case LY_STMT_BIT:
            LY_CHECK_RET(lysp_stmt_type_enum(ctx, child, &type->bits));
            type->flags |= LYS_SET_BIT;
            break;
        case LY_STMT_ENUM:
            LY_CHECK_RET(lysp_stmt_type_enum(ctx, child, &type->enums));
            type->flags |= LYS_SET_ENUM;
            break;
        case LY_STMT_FRACTION_DIGITS:
            LY_CHECK_RET(lysp_stmt_type_fracdigits(ctx, child, &type->fraction_digits, &type->exts));
            type->flags |= LYS_SET_FRDIGITS;
            break;
        case LY_STMT_LENGTH:
            if (type->length) {
                LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, lyplg_ext_stmt2str(child->kw));
                return LY_EVALID;
            }
            type->length = calloc(1, sizeof *type->length);
            LY_CHECK_ERR_RET(!type->length, LOGMEM(PARSER_CTX(ctx)), LY_EMEM);

            LY_CHECK_RET(lysp_stmt_restr(ctx, child, type->length));
            type->flags |= LYS_SET_LENGTH;
            break;
        case LY_STMT_PATH:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &str_path, Y_STR_ARG, &type->exts));
            ret = ly_path_parse(PARSER_CTX(ctx), NULL, str_path, 0, 1, LY_PATH_BEGIN_EITHER,
                    LY_PATH_PREFIX_OPTIONAL, LY_PATH_PRED_LEAFREF, &type->path);
            lydict_remove(PARSER_CTX(ctx), str_path);
            LY_CHECK_RET(ret);
            type->flags |= LYS_SET_PATH;
            break;
        case LY_STMT_PATTERN:
            LY_CHECK_RET(lysp_stmt_type_pattern(ctx, child, &type->patterns));
            type->flags |= LYS_SET_PATTERN;
            break;
        case LY_STMT_RANGE:
            if (type->range) {
                LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, lyplg_ext_stmt2str(child->kw));
                return LY_EVALID;
            }
            type->range = calloc(1, sizeof *type->range);
            LY_CHECK_ERR_RET(!type->range, LOGMEM(PARSER_CTX(ctx)), LY_EMEM);

            LY_CHECK_RET(lysp_stmt_restr(ctx, child, type->range));
            type->flags |= LYS_SET_RANGE;
            break;
        case LY_STMT_REQUIRE_INSTANCE:
            LY_CHECK_RET(lysp_stmt_type_reqinstance(ctx, child, &type->require_instance, &type->flags, &type->exts));
            /* LYS_SET_REQINST checked and set inside lysp_stmt_type_reqinstance() */
            break;
        case LY_STMT_TYPE:
            LY_ARRAY_NEW_RET(PARSER_CTX(ctx), type->types, nest_type, LY_EMEM);
            LY_CHECK_RET(lysp_stmt_type(ctx, child, nest_type));
            type->flags |= LYS_SET_TYPE;
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(lysp_stmt_ext(ctx, child, LY_STMT_TYPE, 0, &type->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw), "type");
            return LY_EVALID;
        }
    }
    return LY_SUCCESS;
}